

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O2

void packforblock10_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  int iVar29;
  
  iVar29 = (int)base;
  puVar1 = (ulong *)*pw;
  puVar2 = *pin;
  uVar3 = puVar2[6];
  uVar4 = puVar2[7];
  uVar5 = puVar2[8];
  uVar6 = puVar2[9];
  uVar19 = puVar2[10];
  uVar20 = puVar2[0xb];
  uVar7 = puVar2[0xc];
  uVar8 = puVar2[0xd];
  uVar9 = puVar2[0xe];
  uVar10 = puVar2[0xf];
  uVar21 = puVar2[0x10];
  uVar22 = puVar2[0x11];
  uVar23 = puVar2[0x12];
  uVar11 = puVar2[0x13];
  uVar12 = puVar2[0x14];
  uVar13 = puVar2[0x15];
  uVar14 = puVar2[0x16];
  uVar24 = puVar2[0x17];
  uVar25 = puVar2[0x18];
  uVar15 = puVar2[0x19];
  uVar16 = puVar2[0x1a];
  uVar17 = puVar2[0x1b];
  uVar18 = puVar2[0x1c];
  uVar26 = puVar2[0x1d];
  uVar27 = puVar2[0x1e];
  uVar28 = puVar2[0x1f];
  *puVar1 = uVar3 - base << 0x3c |
            (ulong)(uint)((int)puVar2[5] - iVar29) << 0x32 |
            (ulong)(uint)((int)puVar2[4] - iVar29) << 0x28 |
            (puVar2[3] - base) * 0x40000000 | (puVar2[2] - base) * 0x100000 |
            (puVar2[1] - base) * 0x400 | *puVar2 - base;
  puVar1[1] = uVar7 - base << 0x38 |
              (ulong)(uint)((int)uVar20 - iVar29) << 0x2e |
              (ulong)(uint)((int)uVar19 - iVar29) << 0x24 |
              (uVar6 - base) * 0x4000000 | (uVar5 - base) * 0x10000 |
              (uVar4 - base) * 0x40 | uVar3 - base >> 4;
  puVar1[2] = uVar11 - base << 0x3e |
              (ulong)(uint)((int)uVar23 - iVar29) << 0x34 |
              (ulong)(uint)((int)uVar22 - iVar29) << 0x2a |
              (ulong)(uint)((int)uVar21 - iVar29) << 0x20 |
              (uVar10 - base) * 0x400000 | (uVar9 - base) * 0x1000 |
              (uVar8 - base) * 4 | uVar7 - base >> 8;
  puVar1[3] = uVar15 - base << 0x3a |
              (ulong)(uint)((int)uVar25 - iVar29) << 0x30 |
              (ulong)(uint)((int)uVar24 - iVar29) << 0x26 |
              (uVar14 - base) * 0x10000000 | (uVar13 - base) * 0x40000 |
              (uVar12 - base) * 0x100 | uVar11 - base >> 2;
  puVar1[4] = (ulong)(uint)((int)uVar28 - iVar29) << 0x36 |
              (ulong)(uint)((int)uVar27 - iVar29) << 0x2c |
              (ulong)(uint)((int)uVar26 - iVar29) << 0x22 |
              (uVar18 - base) * 0x1000000 | (uVar17 - base) * 0x4000 |
              (uVar16 - base) * 0x10 | uVar15 - base >> 6;
  *pin = puVar2 + 0x20;
  *pw = *pw + 0x28;
  return;
}

Assistant:

static void packforblock10_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  5 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 10;
  w0 |=  (in[2] - base) << 20;
  w0 |=  (in[3] - base) << 30;
  w0 |=  (in[4] - base) << 40;
  w0 |=  (in[5] - base) << 50;
  w0 |= (in[6] - base) << 60;
  w1 = (in[6] - base) >> 4;
  w1 |=  (in[7] - base) << 6;
  w1 |=  (in[8] - base) << 16;
  w1 |=  (in[9] - base) << 26;
  w1 |=  (in[10] - base) << 36;
  w1 |=  (in[11] - base) << 46;
  w1 |= (in[12] - base) << 56;
  w2 = (in[12] - base) >> 8;
  w2 |=  (in[13] - base) << 2;
  w2 |=  (in[14] - base) << 12;
  w2 |=  (in[15] - base) << 22;
  w2 |=  (in[16] - base) << 32;
  w2 |=  (in[17] - base) << 42;
  w2 |=  (in[18] - base) << 52;
  w2 |= (in[19] - base) << 62;
  w3 = (in[19] - base) >> 2;
  w3 |=  (in[20] - base) << 8;
  w3 |=  (in[21] - base) << 18;
  w3 |=  (in[22] - base) << 28;
  w3 |=  (in[23] - base) << 38;
  w3 |=  (in[24] - base) << 48;
  w3 |= (in[25] - base) << 58;
  w4 = (in[25] - base) >> 6;
  w4 |=  (in[26] - base) << 4;
  w4 |=  (in[27] - base) << 14;
  w4 |=  (in[28] - base) << 24;
  w4 |=  (in[29] - base) << 34;
  w4 |=  (in[30] - base) << 44;
  w4 |=  (in[31] - base) << 54;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 40; /* we used up 40 output bytes */ 
}